

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lys_parse_load(ly_ctx *ctx,char *name,char *revision,ly_set *new_mods,lys_module **mod)

{
  LY_ERR LVar1;
  lys_module *plVar2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lys_module *mod_latest;
  lys_module **mod_local;
  ly_set *new_mods_local;
  char *revision_local;
  char *name_local;
  ly_ctx *ctx_local;
  
  _ret___1 = (lys_module *)0x0;
  if ((mod == (lys_module **)0x0) || (new_mods == (ly_set *)0x0)) {
    __assert_fail("mod && new_mods",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                  ,0x3b8,
                  "LY_ERR lys_parse_load(struct ly_ctx *, const char *, const char *, struct ly_set *, struct lys_module **)"
                 );
  }
  if (revision == (char *)0x0) {
    plVar2 = lys_get_module_without_revision(ctx,name);
    *mod = plVar2;
    if (((*mod != (lys_module *)0x0) && ((*mod)->implemented == '\0')) &&
       (((*mod)->latest_revision & 4) == 0)) {
      _ret___1 = *mod;
      *mod = (lys_module *)0x0;
    }
  }
  else {
    plVar2 = ly_ctx_get_module(ctx,name,revision);
    *mod = plVar2;
  }
  if (*mod == (lys_module *)0x0) {
    LVar1 = lys_parse_load_from_clb_or_file(ctx,name,revision,_ret___1,new_mods,mod);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if ((*mod == (lys_module *)0x0) && (_ret___1 == (lys_module *)0x0)) {
      ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Loading \"%s\" module failed.",name);
      return LY_EVALID;
    }
    if (*mod == (lys_module *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
             "Newer revision than \"%s@%s\" not found, using this as the latest revision.",
             _ret___1->name,_ret___1->revision);
      if ((_ret___1->latest_revision & 1) == 0) {
        __assert_fail("mod_latest->latest_revision & LYS_MOD_LATEST_REV",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                      ,0x3da,
                      "LY_ERR lys_parse_load(struct ly_ctx *, const char *, const char *, struct ly_set *, struct lys_module **)"
                     );
      }
      _ret___1->latest_revision = _ret___1->latest_revision | 2;
      *mod = _ret___1;
    }
    else if (((*mod != (lys_module *)0x0) && (revision == (char *)0x0)) &&
            (((*mod)->latest_revision & 1) != 0)) {
      (*mod)->latest_revision = (*mod)->latest_revision | 2;
    }
  }
  ctx_local._4_4_ = lys_check_circular_dependency(ctx,mod);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
lys_parse_load(struct ly_ctx *ctx, const char *name, const char *revision, struct ly_set *new_mods,
        struct lys_module **mod)
{
    struct lys_module *mod_latest = NULL;

    assert(mod && new_mods);

    /*
     * Try to get the module from the context.
     */
    if (revision) {
        /* Get the specific revision. */
        *mod = ly_ctx_get_module(ctx, name, revision);
    } else {
        /* Get the requested module in a suitable revision in the context. */
        *mod = lys_get_module_without_revision(ctx, name);
        if (*mod && !(*mod)->implemented && !((*mod)->latest_revision & LYS_MOD_IMPORTED_REV)) {
            /* Let us now search with callback and searchpaths to check
             * if there is newer revision outside the context.
             */
            mod_latest = *mod;
            *mod = NULL;
        }
    }

    if (!*mod) {
        /* No suitable module in the context, try to load it. */
        LY_CHECK_RET(lys_parse_load_from_clb_or_file(ctx, name, revision, mod_latest, new_mods, mod));
        if (!*mod && !mod_latest) {
            LOGVAL(ctx, LYVE_REFERENCE, "Loading \"%s\" module failed.", name);
            return LY_EVALID;
        }

        /* Update the latest_revision flag - here we have selected the latest available schema,
         * consider that even the callback provides correct latest revision.
         */
        if (!*mod) {
            LOGVRB("Newer revision than \"%s@%s\" not found, using this as the latest revision.",
                    mod_latest->name, mod_latest->revision);
            assert(mod_latest->latest_revision & LYS_MOD_LATEST_REV);
            mod_latest->latest_revision |= LYS_MOD_LATEST_SEARCHDIRS;
            *mod = mod_latest;
        } else if (*mod && !revision && ((*mod)->latest_revision & LYS_MOD_LATEST_REV)) {
            (*mod)->latest_revision |= LYS_MOD_LATEST_SEARCHDIRS;
        }
    }

    /* Checking the circular dependence of imported modules. */
    LY_CHECK_RET(lys_check_circular_dependency(ctx, mod));

    return LY_SUCCESS;
}